

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

Dims * adios2::helper::StringToDims(Dims *__return_storage_ptr__,string *dimensions)

{
  int iVar1;
  iterator iVar2;
  pointer puVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  string s;
  ulonglong local_60;
  char *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (dimensions->_M_string_length == 0) {
    uVar10 = 0;
    uVar9 = 0;
  }
  else {
    uVar11 = 0;
    uVar10 = 0;
    do {
      if ((dimensions->_M_dataplus)._M_p[uVar11] == ',') {
        std::__cxx11::string::string((string *)local_50,(string *)dimensions,uVar10,uVar11 - uVar10)
        ;
        pcVar4 = local_50[0];
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtoull(pcVar4,&local_58,10);
        if (local_58 == pcVar4) {
          std::__throw_invalid_argument("stoull");
LAB_0041736e:
          std::__throw_out_of_range("stoull");
          goto LAB_0041737a;
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) goto LAB_0041736e;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60 = uVar6;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(__return_storage_ptr__,iVar2,&local_60);
        }
        else {
          *iVar2._M_current = uVar6;
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        uVar10 = uVar11 + 1;
        uVar11 = uVar10;
      }
      uVar11 = uVar11 + 1;
      uVar9 = dimensions->_M_string_length;
    } while (uVar11 < uVar9);
  }
  std::__cxx11::string::string((string *)local_50,(string *)dimensions,uVar10,uVar9 - uVar10);
  pcVar4 = local_50[0];
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  uVar7 = strtoull(pcVar4,&local_58,10);
  if (local_58 == pcVar4) {
LAB_0041737a:
    uVar8 = std::__throw_invalid_argument("stoull");
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    _Unwind_Resume(uVar8);
  }
  if (*piVar5 != 0) {
    if (*piVar5 != 0x22) goto LAB_00417314;
    uVar7 = std::__throw_out_of_range("stoull");
  }
  *piVar5 = iVar1;
LAB_00417314:
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_60 = uVar7;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (__return_storage_ptr__,iVar2,&local_60);
  }
  else {
    *iVar2._M_current = uVar7;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Dims StringToDims(const std::string &dimensions)
{
    std::vector<size_t> shape;
    size_t begin = 0;
    for (size_t end = 0; end < dimensions.size(); ++end)
    {
        if (dimensions[end] == ',')
        {
            std::string s(dimensions, begin, end - begin);
            shape.push_back(stoull(s));
            begin = end + 1;
            end = begin;
        }
    }
    std::string s(dimensions, begin, dimensions.size() - begin);
    shape.push_back(stoull(s));
    return shape;
}